

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool cmDependsFortran::CopyModule
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  bool bVar4;
  string mod_lower;
  string mod_upper;
  string local_e0;
  string mod_dir;
  string stamp;
  string mod;
  string compilerId;
  string local_40;
  
  std::__cxx11::string::string
            ((string *)&mod,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  std::__cxx11::string::string
            ((string *)&stamp,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 3));
  compilerId._M_dataplus._M_p = (pointer)&compilerId.field_2;
  compilerId._M_string_length = 0;
  compilerId.field_2._M_local_buf[0] = '\0';
  if (0x80 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)) {
    std::__cxx11::string::_M_assign((string *)&compilerId);
  }
  cmsys::SystemTools::GetFilenamePath(&mod_dir,&mod);
  if (mod_dir._M_string_length != 0) {
    std::__cxx11::string::append((char *)&mod_dir);
  }
  std::__cxx11::string::string((string *)&mod_upper,(string *)&mod_dir);
  cmsys::SystemTools::GetFilenameName(&local_e0,&mod);
  cmsys::SystemTools::UpperCase(&mod_lower,&local_e0);
  std::__cxx11::string::append((string *)&mod_upper);
  std::__cxx11::string::~string((string *)&mod_lower);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&mod_lower,(string *)&mod_dir);
  cmsys::SystemTools::GetFilenameName(&local_40,&mod);
  cmsys::SystemTools::LowerCase(&local_e0,&local_40);
  std::__cxx11::string::append((string *)&mod_lower);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::append((char *)&mod);
  std::__cxx11::string::append((char *)&mod_upper);
  psVar3 = &mod_lower;
  std::__cxx11::string::append((char *)psVar3);
  bVar1 = cmsys::SystemTools::FileExists(mod_upper._M_dataplus._M_p,true);
  if (bVar1) {
    bVar1 = ModulesDiffer(mod_upper._M_dataplus._M_p,stamp._M_dataplus._M_p,
                          compilerId._M_dataplus._M_p);
    bVar4 = true;
    if (!bVar1) goto LAB_0040ae1b;
    psVar3 = &mod_upper;
    bVar1 = cmsys::SystemTools::CopyFileAlways(psVar3,&stamp);
    if (bVar1) goto LAB_0040ae1b;
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error copying Fortran module from \"");
LAB_0040ad93:
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2,"\" to \"");
    psVar3 = &stamp;
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(mod_lower._M_dataplus._M_p,true);
    if (bVar1) {
      bVar1 = ModulesDiffer(mod_lower._M_dataplus._M_p,stamp._M_dataplus._M_p,
                            compilerId._M_dataplus._M_p);
      bVar4 = true;
      if (!bVar1) goto LAB_0040ae1b;
      psVar3 = &mod_lower;
      bVar1 = cmsys::SystemTools::CopyFileAlways(psVar3,&stamp);
      if (bVar1) goto LAB_0040ae1b;
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error copying Fortran module from \"");
      goto LAB_0040ad93;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error copying Fortran module \"");
    poVar2 = std::operator<<(poVar2,(string *)
                                    ((args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 2));
    poVar2 = std::operator<<(poVar2,"\".  Tried \"");
    poVar2 = std::operator<<(poVar2,(string *)&mod_upper);
    poVar2 = std::operator<<(poVar2,"\" and \"");
  }
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  std::operator<<(poVar2,"\".\n");
  bVar4 = false;
LAB_0040ae1b:
  std::__cxx11::string::~string((string *)&mod_lower);
  std::__cxx11::string::~string((string *)&mod_upper);
  std::__cxx11::string::~string((string *)&mod_dir);
  std::__cxx11::string::~string((string *)&compilerId);
  std::__cxx11::string::~string((string *)&stamp);
  std::__cxx11::string::~string((string *)&mod);
  return bVar4;
}

Assistant:

bool cmDependsFortran::CopyModule(const std::vector<std::string>& args)
{
  // Implements
  //
  //   $(CMAKE_COMMAND) -E cmake_copy_f90_mod input.mod output.mod.stamp
  //                                          [compiler-id]
  //
  // Note that the case of the .mod file depends on the compiler.  In
  // the future this copy could also account for the fact that some
  // compilers include a timestamp in the .mod file so it changes even
  // when the interface described in the module does not.

  std::string mod = args[2];
  std::string stamp = args[3];
  std::string compilerId;
  if (args.size() >= 5) {
    compilerId = args[4];
  }
  std::string mod_dir = cmSystemTools::GetFilenamePath(mod);
  if (!mod_dir.empty()) {
    mod_dir += "/";
  }
  std::string mod_upper = mod_dir;
  mod_upper += cmSystemTools::UpperCase(cmSystemTools::GetFilenameName(mod));
  std::string mod_lower = mod_dir;
  mod_lower += cmSystemTools::LowerCase(cmSystemTools::GetFilenameName(mod));
  mod += ".mod";
  mod_upper += ".mod";
  mod_lower += ".mod";
  if (cmSystemTools::FileExists(mod_upper.c_str(), true)) {
    if (cmDependsFortran::ModulesDiffer(mod_upper.c_str(), stamp.c_str(),
                                        compilerId.c_str())) {
      if (!cmSystemTools::CopyFileAlways(mod_upper, stamp)) {
        std::cerr << "Error copying Fortran module from \"" << mod_upper
                  << "\" to \"" << stamp << "\".\n";
        return false;
      }
    }
    return true;
  }
  if (cmSystemTools::FileExists(mod_lower.c_str(), true)) {
    if (cmDependsFortran::ModulesDiffer(mod_lower.c_str(), stamp.c_str(),
                                        compilerId.c_str())) {
      if (!cmSystemTools::CopyFileAlways(mod_lower, stamp)) {
        std::cerr << "Error copying Fortran module from \"" << mod_lower
                  << "\" to \"" << stamp << "\".\n";
        return false;
      }
    }
    return true;
  }

  std::cerr << "Error copying Fortran module \"" << args[2] << "\".  Tried \""
            << mod_upper << "\" and \"" << mod_lower << "\".\n";
  return false;
}